

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkmaze.c
# Opt level: O1

void place_vibrating_square(level *lev)

{
  int iVar1;
  boolean bVar2;
  uint uVar3;
  int iVar4;
  int y1;
  int x1;
  long lVar5;
  int iVar6;
  long lVar7;
  char x;
  uint x0;
  char y;
  
  lVar7 = (long)x_maze_max;
  lVar5 = (long)y_maze_max;
  inv_pos.x = '\0';
  inv_pos.y = '\0';
  do {
    do {
      do {
        do {
          do {
            uVar3 = mt_random();
            x0 = SUB164(ZEXT416(uVar3) % SEXT816(lVar7 + -0xb),0) + 7;
            uVar3 = mt_random();
            x1 = (int)(lev->upstair).sx;
            iVar4 = x0 - x1;
          } while (iVar4 == 0);
          uVar3 = SUB164(ZEXT416(uVar3) % SEXT816(lVar5 + -9),0) + 6;
          y1 = (int)(lev->upstair).sy;
          iVar6 = uVar3 - y1;
        } while (iVar6 == 0);
        iVar1 = -iVar4;
        if (0 < iVar4) {
          iVar1 = iVar4;
        }
        iVar4 = -iVar6;
        if (0 < iVar6) {
          iVar4 = iVar6;
        }
      } while (iVar1 == iVar4);
      iVar4 = distmin(x0,uVar3,x1,y1);
    } while ((iVar4 < 0xc) || (lev->locations[x0][uVar3].typ < '\x18'));
    x = (char)x0;
    y = (char)uVar3;
    bVar2 = occupied(lev,x,y);
  } while (bVar2 != '\0');
  inv_pos.y = y;
  inv_pos.x = x;
  maketrap(lev,(int)x,(int)y,0xf);
  if (urole.malenum == 0x159) {
    make_engr_at(lev,(int)inv_pos.x,(int)inv_pos.y,"X",0,'\x01');
    return;
  }
  return;
}

Assistant:

static void place_vibrating_square(struct level *lev)
{
	/*
	 * Pick a position where the stairs down to Moloch's Sanctum
	 * level will ultimately be created.  At that time, an area
	 * will be altered:  walls removed, moat and traps generated,
	 * boulders destroyed.  The position picked here must ensure
	 * that that invocation area won't extend off the map.
	 *
	 * We actually allow up to 2 squares around the usual edge of
	 * the area to get truncated; see mkinvokearea(mklev.c).
	 */
	const int x_maze_min = 2;
	const int y_maze_min = 2;
	const int INVPOS_X_MARGIN = 6 - 2;
	const int INVPOS_Y_MARGIN = 5 - 2;
	const int INVPOS_DISTANCE = 11;

	int x_range = x_maze_max - x_maze_min - 2*INVPOS_X_MARGIN - 1,
	    y_range = y_maze_max - y_maze_min - 2*INVPOS_Y_MARGIN - 1;
	int x, y;

	inv_pos.x = inv_pos.y = 0; /*{occupied() => invocation_pos()}*/
	do {
	    x = rn1(x_range, x_maze_min + INVPOS_X_MARGIN + 1);
	    y = rn1(y_range, y_maze_min + INVPOS_Y_MARGIN + 1);
	    /* we don't want it to be too near the stairs, nor
	       to be on a spot that's already in use (wall|trap) */
	} while (x == lev->upstair.sx || y == lev->upstair.sy ||	/*(direct line)*/
		 abs(x - lev->upstair.sx) == abs(y - lev->upstair.sy) ||
		 distmin(x, y, lev->upstair.sx, lev->upstair.sy) <= INVPOS_DISTANCE ||
		 !SPACE_POS(lev->locations[x][y].typ) || occupied(lev, x, y));
	inv_pos.x = x;
	inv_pos.y = y;
	maketrap(lev, inv_pos.x, inv_pos.y, VIBRATING_SQUARE);

	/* "'X' never, ever marks the spot." */
	if (Role_if(PM_ARCHEOLOGIST))
	    make_engr_at(lev, inv_pos.x, inv_pos.y, "X", 0L, DUST);
}